

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong *puVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  size_t nblimbs;
  
  nblimbs = ((buflen >> 3) + 1) - (ulong)((buflen & 7) == 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
    iVar2 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = mbedtls_mpi_lset(X,0);
  if (iVar2 == 0) {
    pbVar3 = buf + buflen;
    iVar2 = 0;
    bVar4 = 0;
    for (uVar5 = 0; pbVar3 = pbVar3 + -1, buflen != uVar5; uVar5 = uVar5 + 1) {
      puVar1 = (ulong *)((long)X->p + (uVar5 & 0xfffffffffffffff8));
      *puVar1 = *puVar1 | (ulong)*pbVar3 << (bVar4 & 0x38);
      bVar4 = bVar4 + 8;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t i, j;
    size_t const limbs = CHARS_TO_LIMBS( buflen );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = buflen, j = 0; i > 0; i--, j++ )
        X->p[j / ciL] |= ((mbedtls_mpi_uint) buf[i - 1]) << ((j % ciL) << 3);

cleanup:

    return( ret );
}